

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O3

void lws_destroy_event_pipe(lws *wsi)

{
  int iVar1;
  lws_log_cx *cx;
  
  cx = lwsl_wsi_get_cx(wsi);
  _lws_log_cx(cx,lws_log_prepend_wsi,wsi,8,"lws_destroy_event_pipe","in");
  iVar1 = lws_wsi_extract_from_loop(wsi);
  lws_plat_pipe_close(wsi);
  if (iVar1 != 0) {
    return;
  }
  lws_realloc(wsi,0,"lws_free");
  return;
}

Assistant:

void
lws_destroy_event_pipe(struct lws *wsi)
{
	int n;

	lwsl_wsi_info(wsi, "in");

	n = lws_wsi_extract_from_loop(wsi);
	lws_plat_pipe_close(wsi);
	if (!n)
		lws_free(wsi);
}